

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::ExtractSnapHandler
          (DynamicTypeHandler *this,SnapHandler *handler,ThreadContext *threadContext,
          SlabAllocator *alloc)

{
  byte bVar1;
  uint32 uVar2;
  SnapHandlerPropertyEntry *pSVar3;
  SlabAllocator *alloc_local;
  ThreadContext *threadContext_local;
  SnapHandler *handler_local;
  DynamicTypeHandler *this_local;
  
  handler->HandlerId = (TTD_PTR_ID)this;
  handler->InlineSlotCapacity = (uint)this->inlineSlotCapacity;
  handler->TotalSlotCapacity = this->slotCapacity;
  handler->MaxPropertyIndex = 0;
  handler->PropertyInfoArray = (SnapHandlerPropertyEntry *)0x0;
  if (handler->TotalSlotCapacity != 0) {
    pSVar3 = TTD::SlabAllocatorBase<0>::
             SlabReserveArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>
                       (alloc,(ulong)handler->TotalSlotCapacity);
    handler->PropertyInfoArray = pSVar3;
    memset(handler->PropertyInfoArray,0,(ulong)handler->TotalSlotCapacity << 3);
    uVar2 = (*this->_vptr_DynamicTypeHandler[0x65])
                      (this,handler->PropertyInfoArray,threadContext,alloc);
    handler->MaxPropertyIndex = uVar2;
    if (handler->TotalSlotCapacity < handler->MaxPropertyIndex) {
      TTDAbort_unrecoverable_error("Huh we have more property entries than slots to put them in.");
    }
    if (handler->MaxPropertyIndex == 0) {
      TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>
                (alloc,(ulong)handler->TotalSlotCapacity);
      handler->PropertyInfoArray = (SnapHandlerPropertyEntry *)0x0;
    }
    else {
      TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>
                (alloc,(ulong)handler->MaxPropertyIndex,(ulong)handler->TotalSlotCapacity);
    }
  }
  bVar1 = GetFlags(this);
  handler->IsExtensibleFlag = bVar1 & 1;
  return;
}

Assistant:

void DynamicTypeHandler::ExtractSnapHandler(TTD::NSSnapType::SnapHandler* handler, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        handler->HandlerId = TTD_CONVERT_TYPEINFO_TO_PTR_ID(this);

        handler->InlineSlotCapacity = this->inlineSlotCapacity;
        handler->TotalSlotCapacity = this->slotCapacity;

        handler->MaxPropertyIndex = 0;
        handler->PropertyInfoArray = nullptr;

        if(handler->TotalSlotCapacity != 0)
        {
            handler->PropertyInfoArray = alloc.SlabReserveArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(handler->TotalSlotCapacity);
            memset(handler->PropertyInfoArray, 0, handler->TotalSlotCapacity * sizeof(TTD::NSSnapType::SnapHandlerPropertyEntry));

            handler->MaxPropertyIndex = this->ExtractSlotInfo_TTD(handler->PropertyInfoArray, threadContext, alloc);
            TTDAssert(handler->MaxPropertyIndex <= handler->TotalSlotCapacity, "Huh we have more property entries than slots to put them in.");

            if(handler->MaxPropertyIndex != 0)
            {
                alloc.SlabCommitArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(handler->MaxPropertyIndex, handler->TotalSlotCapacity);
            }
            else
            {
                alloc.SlabAbortArraySpace<TTD::NSSnapType::SnapHandlerPropertyEntry>(handler->TotalSlotCapacity);
                handler->PropertyInfoArray = nullptr;
            }
        }

        //The kind of type this snaptype record is associated with and the extensible flag
        handler->IsExtensibleFlag = this->GetFlags() & Js::DynamicTypeHandler::IsExtensibleFlag;
    }